

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

int count_buc(obj *list,int type)

{
  boolean bVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  iVar3 = 0;
  do {
    if (list == (obj *)0x0) {
      return iVar3;
    }
    if (urole.malenum == 0x161) {
      list->field_0x4a = list->field_0x4a | 0x40;
    }
    if (type == 0x800) {
      bVar1 = not_fully_identified_core(list,'\x01');
      iVar3 = (iVar3 + 1) - (uint)(bVar1 == '\0');
    }
    else if (type == 0x100) {
      if (list->oclass != '\f') {
        uVar2 = ~*(uint *)&list->field_0x4a & 0x41;
LAB_001a9b99:
        bVar4 = uVar2 == 0;
LAB_001a9bad:
        iVar3 = iVar3 + (uint)bVar4;
      }
    }
    else if (type == 0x200) {
      if (list->oclass != '\f') {
        iVar3 = iVar3 + (uint)((*(uint *)&list->field_0x4a & 0x43) == 0x40);
      }
    }
    else if (type == 0x400) {
      if (list->oclass != '\f') {
        bVar4 = (list->field_0x4a & 0x40) == 0;
        goto LAB_001a9bad;
      }
    }
    else {
      if (type != 0x80) {
        impossible("need count of curse status %d?",type);
        return 0;
      }
      if (list->oclass != '\f') {
        uVar2 = ~*(uint *)&list->field_0x4a & 0x42;
        goto LAB_001a9b99;
      }
    }
    list = list->nobj;
  } while( true );
}

Assistant:

int count_buc(struct obj *list, int type)
{
    int count = 0;

    while (list) {
	if (Role_if (PM_PRIEST)) list->bknown = TRUE;
	switch(type) {
	    case BUC_BLESSED:
		if (list->oclass != COIN_CLASS && list->bknown && list->blessed)
		    count++;
		break;
	    case BUC_CURSED:
		if (list->oclass != COIN_CLASS && list->bknown && list->cursed)
		    count++;
		break;
	    case BUC_UNCURSED:
		if (list->oclass != COIN_CLASS &&
			list->bknown && !list->blessed && !list->cursed)
		    count++;
		break;
	    case BUC_UNKNOWN:
		if (list->oclass != COIN_CLASS && !list->bknown)
		    count++;
		break;
	    case UNIDENTIFIED:
		if (not_fully_identified_core(list, TRUE))
		    count++;
		break;
	    default:
		impossible("need count of curse status %d?", type);
		return 0;
	}
	list = list->nobj;
    }
    return count;
}